

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

void __thiscall
tchecker::parsing::edge_declaration_t::edge_declaration_t
          (edge_declaration_t *this,
          shared_ptr<const_tchecker::parsing::process_declaration_t> *process,
          shared_ptr<const_tchecker::parsing::location_declaration_t> *src,
          shared_ptr<const_tchecker::parsing::location_declaration_t> *tgt,
          shared_ptr<const_tchecker::parsing::event_declaration_t> *event,attributes_t *attr,
          string *context)

{
  bool bVar1;
  element_type *peVar2;
  process_declaration_t *ppVar3;
  string *psVar4;
  element_type *peVar5;
  string *psVar6;
  invalid_argument *piVar7;
  attributes_t *attr_local;
  shared_ptr<const_tchecker::parsing::event_declaration_t> *event_local;
  shared_ptr<const_tchecker::parsing::location_declaration_t> *tgt_local;
  shared_ptr<const_tchecker::parsing::location_declaration_t> *src_local;
  shared_ptr<const_tchecker::parsing::process_declaration_t> *process_local;
  edge_declaration_t *this_local;
  
  inner_declaration_t::declaration_t(&this->super_inner_declaration_t,attr,context);
  (this->super_inner_declaration_t).super_declaration_t._vptr_declaration_t =
       (_func_int **)&PTR__edge_declaration_t_003b5ae0;
  std::shared_ptr<const_tchecker::parsing::process_declaration_t>::shared_ptr
            (&this->_process,process);
  std::shared_ptr<const_tchecker::parsing::location_declaration_t>::shared_ptr(&this->_src,src);
  std::shared_ptr<const_tchecker::parsing::location_declaration_t>::shared_ptr(&this->_tgt,tgt);
  std::shared_ptr<const_tchecker::parsing::event_declaration_t>::shared_ptr(&this->_event,event);
  peVar2 = std::
           __shared_ptr_access<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_src);
  ppVar3 = location_declaration_t::process(peVar2);
  psVar4 = process_declaration_t::name_abi_cxx11_(ppVar3);
  peVar5 = std::
           __shared_ptr_access<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_process);
  psVar6 = process_declaration_t::name_abi_cxx11_(peVar5);
  bVar1 = std::operator!=(psVar4,psVar6);
  if (bVar1) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar7,"error, edge declaration has source location that does not belong to process")
    ;
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar2 = std::
           __shared_ptr_access<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_tgt);
  ppVar3 = location_declaration_t::process(peVar2);
  psVar4 = process_declaration_t::name_abi_cxx11_(ppVar3);
  peVar5 = std::
           __shared_ptr_access<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_process);
  psVar6 = process_declaration_t::name_abi_cxx11_(peVar5);
  bVar1 = std::operator!=(psVar4,psVar6);
  if (!bVar1) {
    return;
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar7,"error, edge declaration has target location does not belong to process");
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

edge_declaration_t::edge_declaration_t(std::shared_ptr<tchecker::parsing::process_declaration_t const> const & process,
                                       std::shared_ptr<tchecker::parsing::location_declaration_t const> const & src,
                                       std::shared_ptr<tchecker::parsing::location_declaration_t const> const & tgt,
                                       std::shared_ptr<tchecker::parsing::event_declaration_t const> const & event,
                                       tchecker::parsing::attributes_t const & attr, std::string const & context)
    : tchecker::parsing::inner_declaration_t(attr, context), _process(process), _src(src), _tgt(tgt), _event(event)
{
  if (_src->process().name() != _process->name())
    throw std::invalid_argument("error, edge declaration has source location that does not belong to process");

  if (_tgt->process().name() != _process->name())
    throw std::invalid_argument("error, edge declaration has target location does not belong to process");
}